

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImVec4 *pIVar1;
  ImVec2 IVar2;
  char cVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  int iVar9;
  ImGuiTableColumn *p_1;
  ImGuiTableColumn *pIVar10;
  char *__function;
  ImGuiTableColumn *p;
  long lVar11;
  ImGuiTableColumn *pIVar12;
  int iVar13;
  ImGuiTableCellData *cell_data;
  ImGuiTableCellData *pIVar14;
  int iVar15;
  ImGuiTableCellData *pIVar16;
  int iVar17;
  ImU32 col;
  ImU32 col_00;
  uint uVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar26;
  undefined1 auVar25 [16];
  float fVar27;
  float fVar28;
  float fVar30;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  ImRect IVar32;
  ImVec2 local_80;
  ImVec2 local_78;
  ImU32 local_70;
  int local_6c;
  int local_68;
  int local_64;
  ImVec2 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar4 = GImGui->CurrentWindow;
  if (pIVar4 != table->InnerWindow) {
    __assert_fail("window == table->InnerWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x645,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->IsInsideRow == false) {
    __assert_fail("table->IsInsideRow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x646,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  fVar28 = table->RowPosY2;
  auVar24 = ZEXT416((uint)fVar28);
  (pIVar4->DC).CursorPos.y = fVar28;
  fVar27 = table->RowPosY1;
  auVar20 = ZEXT416((uint)fVar27);
  iVar9 = table->CurrentRow;
  if (iVar9 == 0) {
    table->LastFirstRowHeight = fVar28 - fVar27;
  }
  iVar13 = iVar9 + 1;
  iVar15 = (int)table->FreezeRowsCount;
  iVar17 = (int)table->FreezeRowsRequest;
  if (((table->InnerClipRect).Min.y <= fVar28) && (fVar27 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    local_6c = iVar17;
    local_58 = auVar20;
    local_48 = auVar24;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
      iVar9 = table->CurrentRow;
    }
    col = table->RowBgColor[1];
    local_70 = 0;
    if (col == 0x1000000) {
      col = 0;
    }
    if (((0 < iVar9) || (table->InnerWindow == table->OuterWindow)) &&
       (local_70 = 0, (table->Flags & 0x80) != 0)) {
      local_70 = table->RowBgColor[(ulong)((table->field_0x92 & 1) == 0) + 2];
    }
    cVar3 = table->RowCellDataCurrent;
    local_64 = iVar13;
    if ((-1 < cVar3 || iVar13 == iVar15) || (local_70 != 0 || (col != 0 || col_00 != 0))) {
      if ((table->Flags & 0x80000) == 0) {
        fVar28 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar27 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar30 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar5 = pIVar4->DrawList;
        (pIVar5->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar5->_CmdHeader).ClipRect.y = fVar28;
        (pIVar5->_CmdHeader).ClipRect.z = fVar27;
        (pIVar5->_CmdHeader).ClipRect.w = fVar30;
      }
      ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar4->DrawList,0);
    }
    if (col != 0 || col_00 != 0) {
      IVar2 = (table->BgClipRect).Min;
      fVar28 = (table->WorkRect).Min.x;
      fVar27 = IVar2.x;
      fVar30 = IVar2.y;
      uVar18 = -(uint)(fVar27 <= fVar28);
      uVar19 = -(uint)(fVar30 <= (float)local_58._0_4_);
      auVar31._0_4_ = (uint)fVar28 & uVar18;
      auVar31._4_4_ = local_58._0_4_ & uVar19;
      auVar31._8_4_ = 0;
      auVar31._12_4_ = local_58._4_4_ & -(uint)(0.0 <= (float)local_58._4_4_);
      auVar23._0_4_ = ~uVar18 & (uint)fVar27;
      auVar23._4_4_ = ~uVar19 & (uint)fVar30;
      auVar23._8_8_ = 0;
      auVar24 = auVar23 | auVar31;
      local_80 = auVar24._0_8_;
      auVar29._8_8_ = 0;
      auVar29._0_4_ = (table->BgClipRect).Max.x;
      auVar29._4_4_ = (table->BgClipRect).Max.y;
      auVar20._4_4_ = local_48._0_4_;
      auVar20._0_4_ = (table->WorkRect).Max.x;
      auVar20._8_4_ = 0;
      auVar20._12_4_ = local_48._4_4_;
      auVar20 = minps(auVar20,auVar29);
      local_78 = auVar20._0_8_;
      if ((col_00 != 0) &&
         (uVar18 = -(uint)(auVar24._4_4_ < auVar20._4_4_),
         auVar8._4_4_ = -(uint)(auVar24._8_4_ < auVar20._8_4_), auVar8._0_4_ = uVar18,
         auVar8._8_4_ = -(uint)(auVar24._12_4_ < auVar20._12_4_), auVar8._12_4_ = 0,
         auVar24 = auVar8 << 0x20, (uVar18 & 1) != 0)) {
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_80,&local_78,col_00,0.0,0xf);
      }
      if (col != 0) {
        if (local_80.y < local_78.y) {
          ImDrawList::AddRectFilled(pIVar4->DrawList,&local_80,&local_78,col,0.0,0xf);
        }
      }
    }
    local_68 = iVar15;
    if (-1 < cVar3) {
      if (-1 < (long)table->RowCellDataCurrent) {
        pIVar14 = (table->RowCellData).Data;
        pIVar16 = pIVar14 + table->RowCellDataCurrent;
        if (pIVar16 < (table->RowCellData).DataEnd) {
          do {
            uVar26 = auVar24._8_8_;
            cVar3 = pIVar14->Column;
            if (((long)cVar3 < 0) ||
               (pIVar10 = (table->Columns).Data + cVar3, (table->Columns).DataEnd <= pIVar10))
            goto LAB_0018f5d2;
            IVar32 = TableGetCellBgRect(table,(int)cVar3);
            auVar25._0_8_ = IVar32.Max;
            auVar25._8_8_ = uVar26;
            IVar2 = (table->BgClipRect).Min;
            fVar28 = IVar2.x;
            fVar27 = IVar2.y;
            uVar18 = -(uint)(fVar28 <= IVar32.Min.x);
            uVar19 = -(uint)(fVar27 <= IVar32.Min.y);
            fVar30 = (float)(~uVar18 & (uint)fVar28 | (uint)IVar32.Min.x & uVar18);
            auVar21._8_8_ = 0;
            auVar21._0_4_ = (table->BgClipRect).Max.x;
            auVar21._4_4_ = (table->BgClipRect).Max.y;
            auVar20 = minps(auVar25,auVar21);
            fVar28 = (pIVar10->ClipRect).Min.x;
            uVar18 = -(uint)(fVar28 <= fVar30);
            local_80.y = (float)(~uVar19 & (uint)fVar27 | (uint)IVar32.Min.y & uVar19);
            local_80.x = (float)(~uVar18 & (uint)fVar28 | (uint)fVar30 & uVar18);
            auVar24 = auVar20;
            if (pIVar10->MaxX <= auVar20._0_4_) {
              auVar24._4_12_ = auVar20._4_12_;
              auVar24._0_4_ = pIVar10->MaxX;
            }
            local_78.y = auVar20._4_4_;
            local_78.x = auVar24._0_4_;
            ImDrawList::AddRectFilled(pIVar4->DrawList,&local_80,&local_78,pIVar14->BgColor,0.0,0xf)
            ;
            pIVar14 = pIVar14 + 1;
          } while (pIVar14 <= pIVar16);
          goto LAB_0018f351;
        }
      }
      __function = "T &ImSpan<ImGuiTableCellData>::operator[](int) [T = ImGuiTableCellData]";
      goto LAB_0018f5e7;
    }
LAB_0018f351:
    if (((local_70 != 0) && ((table->BgClipRect).Min.y <= (float)local_58._0_4_)) &&
       ((float)local_58._0_4_ < (table->BgClipRect).Max.y)) {
      local_80.y = (float)local_58._0_4_;
      local_80.x = table->BorderX1;
      local_60.x = table->BorderX2;
      local_60.y = (float)local_58._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_80,&local_60,local_70,1.0);
    }
    iVar13 = local_64;
    iVar15 = local_68;
    iVar17 = local_6c;
    if (((local_64 == local_68) && ((table->BgClipRect).Min.y <= (float)local_48._0_4_)) &&
       ((float)local_48._0_4_ < (table->BgClipRect).Max.y)) {
      local_80.y = (float)local_48._0_4_;
      local_80.x = table->BorderX1;
      local_60.x = table->BorderX2;
      local_60.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_80,&local_60,table->BorderColorStrong,1.0);
    }
  }
  if ((iVar13 == iVar17) && (iVar9 = table->ColumnsCount, 0 < (long)iVar9)) {
    pIVar10 = (table->Columns).Data;
    lVar11 = 0;
    do {
      if ((table->Columns).DataEnd <= pIVar10) goto LAB_0018f5d2;
      pIVar10->NavLayerCurrent = lVar11 < table->FreezeColumnsCount;
      lVar11 = lVar11 + 1;
      pIVar10 = pIVar10 + 1;
    } while (iVar9 != lVar11);
  }
  if (iVar13 != iVar15) {
LAB_0018f5ad:
    if ((table->field_0x90 & 1) == 0) {
      table->RowBgColorCounter = table->RowBgColorCounter + 1;
    }
    table->IsInsideRow = false;
    return;
  }
  if (table->IsUnfrozenRows != false) {
    __assert_fail("table->IsUnfrozenRows == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x6a5,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  table->IsUnfrozenRows = true;
  fVar28 = table->RowPosY2;
  fVar27 = (pIVar4->InnerClipRect).Min.y;
  fVar30 = (pIVar4->InnerClipRect).Max.y;
  uVar18 = -(uint)(fVar27 <= fVar28 + 1.0);
  fVar27 = (float)(~uVar18 & (uint)fVar27 | (uint)(fVar28 + 1.0) & uVar18);
  if (fVar30 <= fVar27) {
    fVar27 = fVar30;
  }
  (table->Bg2ClipRectForDrawCmd).Min.y = fVar27;
  (table->BgClipRect).Min.y = fVar27;
  (table->Bg2ClipRectForDrawCmd).Max.y = fVar30;
  (table->BgClipRect).Max.y = fVar30;
  table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
  if (fVar30 < fVar27) {
    __assert_fail("table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x6ad,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  fVar30 = table->RowPosY1;
  fVar22 = (fVar28 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
  (pIVar4->DC).CursorPos.y = fVar22;
  table->RowPosY2 = fVar22;
  table->RowPosY1 = fVar22 - (fVar28 - fVar30);
  lVar11 = (long)table->ColumnsCount;
  pIVar10 = (table->Columns).Data;
  pIVar12 = pIVar10;
  if (0 < lVar11) {
    do {
      if ((table->Columns).DataEnd <= pIVar12) goto LAB_0018f5d2;
      pIVar12->DrawChannelCurrent = pIVar12->DrawChannelUnfrozen;
      (pIVar12->ClipRect).Min.y = fVar27;
      lVar11 = lVar11 + -1;
      pIVar12 = pIVar12 + 1;
    } while (lVar11 != 0);
  }
  if (pIVar10 < (table->Columns).DataEnd) {
    IVar2 = (pIVar10->ClipRect).Min;
    IVar6 = (pIVar10->ClipRect).Max;
    IVar7 = (pIVar10->ClipRect).Max;
    (pIVar4->ClipRect).Min = (pIVar10->ClipRect).Min;
    (pIVar4->ClipRect).Max = IVar7;
    pIVar5 = pIVar4->DrawList;
    (pIVar5->_CmdHeader).ClipRect.x = IVar2.x;
    (pIVar5->_CmdHeader).ClipRect.y = IVar2.y;
    (pIVar5->_CmdHeader).ClipRect.z = IVar6.x;
    (pIVar5->_CmdHeader).ClipRect.w = IVar6.y;
    pIVar1 = (pIVar4->DrawList->_ClipRectStack).Data +
             (long)(pIVar4->DrawList->_ClipRectStack).Size + -1;
    pIVar1->x = IVar2.x;
    pIVar1->y = IVar2.y;
    pIVar1->z = IVar6.x;
    pIVar1->w = IVar6.y;
    pIVar10 = (table->Columns).Data;
    if (pIVar10 < (table->Columns).DataEnd) {
      ImDrawListSplitter::SetCurrentChannel
                (&table->DrawSplitter,pIVar4->DrawList,(uint)pIVar10->DrawChannelCurrent);
      goto LAB_0018f5ad;
    }
  }
LAB_0018f5d2:
  __function = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_0018f5e7:
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                ,0x20c,__function);
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter.SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter.SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}